

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_f6f6::MovieState::setTitle(MovieState *this,SDL_Window *window)

{
  unsigned_long *puVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  unsigned_long fpos;
  size_type pos2;
  size_type pos1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unsigned_long local_b0;
  unsigned_long local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  string local_68 [32];
  string local_48 [32];
  long local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::rfind((char)in_RDI + -0x60,0x2f);
  local_a8 = std::__cxx11::string::rfind((char)in_RDI + -0x60,0x5c);
  local_20 = local_a8;
  if (local_18 != 0xffffffffffffffff) {
    if (local_a8 == 0xffffffffffffffff) {
      local_b0 = local_18;
    }
    else {
      puVar1 = std::max<unsigned_long>(&local_18,&local_20);
      local_b0 = *puVar1;
    }
    local_a8 = local_b0;
  }
  local_28 = local_a8 + 1;
  __lhs = local_88;
  std::__cxx11::string::substr((ulong)__lhs,in_RDI + 0x5a0);
  std::operator+(__lhs,(char *)local_10);
  std::operator+(__lhs,local_10);
  uVar2 = std::__cxx11::string::c_str();
  SDL_SetWindowTitle(local_10,uVar2);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void MovieState::setTitle(SDL_Window *window)
{
    auto pos1 = mFilename.rfind('/');
    auto pos2 = mFilename.rfind('\\');
    auto fpos = ((pos1 == std::string::npos) ? pos2 :
                 (pos2 == std::string::npos) ? pos1 :
                 std::max(pos1, pos2)) + 1;
    SDL_SetWindowTitle(window, (mFilename.substr(fpos)+" - "+AppName).c_str());
}